

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_geometry.cpp
# Opt level: O1

bool dxil_spv::emit_view_id_instruction(Impl *impl,CallInst *instruction)

{
  Id arg;
  Builder *pBVar1;
  Operation *this;
  Capability local_24;
  
  pBVar1 = Converter::Impl::builder(impl);
  arg = SPIRVModule::get_builtin_shader_input(impl->spirv_module,BuiltInViewIndex);
  this = Converter::Impl::allocate(impl,OpLoad,(Value *)instruction);
  Operation::add_id(this,arg);
  Converter::Impl::add(impl,this,false);
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)&pBVar1->capabilities,&local_24);
  return true;
}

Assistant:

bool emit_view_id_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	spv::Id var_id = impl.spirv_module.get_builtin_shader_input(spv::BuiltInViewIndex);
	Operation *op = impl.allocate(spv::OpLoad, instruction);
	op->add_id(var_id);
	impl.add(op);
	builder.addCapability(spv::CapabilityMultiView);
	return true;
}